

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

bool google::protobuf::internal::ReflectionOps::IsInitialized
               (Message *message,bool check_fields,bool check_descendants)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  Descriptor *pDVar4;
  Reflection *this;
  Descriptor *this_00;
  MessageLite *pMVar5;
  FieldDescriptor *pFVar6;
  MapFieldBase *this_01;
  MessageFactory *pMVar7;
  undefined4 extraout_var;
  ExtensionSet *this_02;
  int index;
  ulong uVar8;
  FieldDescriptor *this_03;
  FieldDescriptor *field;
  FieldDescriptor *pFVar9;
  long lVar10;
  Metadata MVar11;
  MapIterator it;
  MapIterator end_map;
  MapIterator local_c0;
  MapIterator local_78;
  
  MVar11 = Message::GetMetadata(message);
  pDVar4 = MVar11.descriptor;
  this = GetReflectionOrDie(message);
  uVar8 = (ulong)(uint)pDVar4->field_count_;
  if (uVar8 != 0) {
    if (pDVar4->field_count_ < 1) {
LAB_0024bee7:
      IsInitialized();
    }
    this_03 = pDVar4->fields_;
    lVar10 = uVar8 * 0x58;
    pFVar9 = this_03;
    if (check_fields) {
      do {
        bVar2 = FieldDescriptor::is_required(pFVar9);
        if ((bVar2) && (bVar2 = Reflection::HasField(this,message,pFVar9), !bVar2)) {
          return false;
        }
        lVar10 = lVar10 + -0x58;
        pFVar9 = pFVar9 + 1;
      } while (lVar10 != 0);
    }
    if (!check_descendants) {
      return true;
    }
    pFVar9 = this_03 + uVar8;
    do {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_03->type_ * 4) == 10) {
        this_00 = FieldDescriptor::message_type(this_03);
        if ((this_00->options_->field_0)._impl_.map_entry_ == true) {
          pFVar6 = Descriptor::field(this_00,1);
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar6->type_ * 4) == 10) {
            this_01 = Reflection::GetMapData(this,message,this_03);
            bVar2 = MapFieldBase::IsMapValid(this_01);
            if (bVar2) {
              MapIterator::MapIterator(&local_c0,message,this_03);
              MapIterator::MapIterator(&local_78,message,this_03);
              MapFieldBase::MapBegin(this_01,&local_c0);
              MapFieldBase::MapEnd(this_01,&local_78);
              bVar2 = MapFieldBase::EqualIterator(local_c0.map_,&local_c0,&local_78);
              while (!bVar2) {
                pMVar5 = &MapValueConstRef::GetMessageValue(&local_c0.value_.super_MapValueConstRef)
                          ->super_MessageLite;
                bVar2 = MessageLite::IsInitialized(pMVar5);
                if (!bVar2) {
                  return false;
                }
                MapFieldBase::IncreaseIterator(local_c0.map_,&local_c0);
                bVar2 = MapFieldBase::EqualIterator(local_c0.map_,&local_c0,&local_78);
              }
            }
          }
        }
        else {
          bVar1 = this_03->field_0x1;
          if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
            IsInitialized();
            goto LAB_0024bee7;
          }
          if ((bVar1 & 0x20) == 0) {
            bVar2 = Reflection::HasField(this,message,this_03);
            if (bVar2) {
              pMVar5 = &Reflection::GetMessage(this,message,this_03,(MessageFactory *)0x0)->
                        super_MessageLite;
              bVar2 = MessageLite::IsInitialized(pMVar5);
              if (!bVar2) {
                return false;
              }
            }
          }
          else {
            iVar3 = Reflection::FieldSize(this,message,this_03);
            if (0 < iVar3) {
              index = 0;
              do {
                pMVar5 = &Reflection::GetRepeatedMessage(this,message,this_03,index)->
                          super_MessageLite;
                bVar2 = MessageLite::IsInitialized(pMVar5);
                if (!bVar2) {
                  return false;
                }
                index = index + 1;
              } while (iVar3 != index);
            }
          }
        }
      }
      this_03 = this_03 + 1;
    } while (this_03 != pFVar9);
  }
  if ((check_descendants) && ((this->schema_).extensions_offset_ != -1)) {
    pMVar7 = MessageFactory::generated_factory();
    iVar3 = (*pMVar7->_vptr_MessageFactory[2])(pMVar7,pDVar4);
    this_02 = Reflection::GetExtensionSet(this,message);
    bVar2 = ExtensionSet::IsInitialized(this_02,(MessageLite *)CONCAT44(extraout_var,iVar3));
    if (!bVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message, bool check_fields,
                                  bool check_descendants) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);
  if (const int field_count = descriptor->field_count()) {
    const FieldDescriptor* begin = descriptor->field(0);
    const FieldDescriptor* end = begin + field_count;
    ABSL_DCHECK_EQ(descriptor->field(field_count - 1), end - 1);

    if (check_fields) {
      // Check required fields of this message.
      for (const FieldDescriptor* field = begin; field != end; ++field) {
        if (field->is_required() && !reflection->HasField(message, field)) {
          return false;
        }
      }
    }

    if (check_descendants) {
      for (const FieldDescriptor* field = begin; field != end; ++field) {
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const Descriptor* message_type = field->message_type();
          if (ABSL_PREDICT_FALSE(message_type->options().map_entry())) {
            if (message_type->field(1)->cpp_type() ==
                FieldDescriptor::CPPTYPE_MESSAGE) {
              const MapFieldBase* map_field =
                  reflection->GetMapData(message, field);
              if (map_field->IsMapValid()) {
                MapIterator it(const_cast<Message*>(&message), field);
                MapIterator end_map(const_cast<Message*>(&message), field);
                for (map_field->MapBegin(&it), map_field->MapEnd(&end_map);
                     it != end_map; ++it) {
                  if (!it.GetValueRef().GetMessageValue().IsInitialized()) {
                    return false;
                  }
                }
              }
            }
          } else if (field->is_repeated()) {
            const int size = reflection->FieldSize(message, field);
            for (int j = 0; j < size; j++) {
              if (!reflection->GetRepeatedMessage(message, field, j)
                       .IsInitialized()) {
                return false;
              }
            }
          } else if (reflection->HasField(message, field)) {
            if (!reflection->GetMessage(message, field).IsInitialized()) {
              return false;
            }
          }
        }
      }
    }
  }
  if (check_descendants && reflection->HasExtensionSet(message)) {
    // Note that "extendee" is only referenced if the extension is lazily parsed
    // (e.g. LazyMessageExtensionImpl), which requires a verification function
    // to be generated.
    //
    // Dynamic messages would get null prototype from the generated message
    // factory but their verification functions are not generated. Therefore, it
    // it will always be eagerly parsed and "extendee" here will not be
    // referenced.
    const Message* extendee =
        MessageFactory::generated_factory()->GetPrototype(descriptor);
    if (!reflection->GetExtensionSet(message).IsInitialized(extendee)) {
      return false;
    }
  }
  return true;
}